

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::ISOYearOperator>
               (interval_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  bool bVar2;
  date_t input;
  date_t input_00;
  BaseStatistics *pBVar3;
  reference pvVar4;
  long val;
  long val_00;
  ValidityMask *pVVar5;
  ulong uVar6;
  BaseStatistics *extraout_RDX;
  LogicalType *other;
  ulong uVar7;
  ValidityMask *unaff_R12;
  BaseStatistics *unaff_R13;
  ValidityMask *unaff_R14;
  interval_t input_01;
  interval_t input_02;
  Value VStack_120;
  LogicalType LStack_e0;
  BaseStatistics BStack_c8;
  BaseStatistics *pBStack_70;
  ValidityMask *pVStack_68;
  BaseStatistics *pBStack_60;
  ValidityMask *pVStack_58;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    pVVar5 = mask;
    mask = unaff_R14;
    if (count == 0) {
      return;
    }
LAB_00cb2f16:
    input_01.micros = (int64_t)result_data;
    input_01._0_8_ = ldata;
    DatePart::ISOYearOperator::Operation<duckdb::interval_t,long>(input_01);
    if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) {
      if (extraout_RDX == (BaseStatistics *)0x0) {
        return;
      }
    }
    else {
      unaff_R13 = (BaseStatistics *)0x0;
      while( true ) {
        if (extraout_RDX == unaff_R13) {
          return;
        }
        puVar1 = (pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        pBVar3 = unaff_R13;
        if (puVar1 != (unsigned_long *)0x0) {
          pBVar3 = (BaseStatistics *)(ulong)*(uint *)((long)puVar1 + (long)unaff_R13 * 4);
        }
        count = (idx_t)dataptr;
        unaff_R12 = pVVar5;
        mask = result_mask;
        if (((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
             [(ulong)pBVar3 >> 6] >> ((ulong)pBVar3 & 0x3f) & 1) != 0) break;
        result_data = (long *)unaff_R13;
        ldata = (interval_t *)dataptr;
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  ((TemplatedValidityMask<unsigned_long> *)dataptr,(idx_t)unaff_R13);
        unaff_R13 = (BaseStatistics *)&(unaff_R13->type).physical_type_;
      }
    }
    input_02.micros = (int64_t)result_data;
    input_02._0_8_ = ldata;
    DatePart::ISOYearOperator::Operation<duckdb::interval_t,long>(input_02);
    pBStack_70 = (BaseStatistics *)count;
    pVStack_68 = unaff_R12;
    pBStack_60 = unaff_R13;
    pVStack_58 = mask;
    pvVar4 = vector<duckdb::BaseStatistics,_true>::get<true>
                       ((vector<duckdb::BaseStatistics,_true> *)result_data,0);
    bVar2 = NumericStats::HasMinMax(pvVar4);
    if (bVar2) {
      input = NumericStats::GetMin<duckdb::date_t>(pvVar4);
      input_00 = NumericStats::GetMax<duckdb::date_t>(pvVar4);
      if (((input.days <= input_00.days) && (bVar2 = Value::IsFinite<duckdb::date_t>(input), bVar2))
         && (bVar2 = Value::IsFinite<duckdb::date_t>(input_00), bVar2)) {
        val = DatePart::ISOYearOperator::Operation<duckdb::date_t,long>(input);
        val_00 = DatePart::ISOYearOperator::Operation<duckdb::date_t,long>(input_00);
        LogicalType::LogicalType(&LStack_e0,other);
        NumericStats::CreateEmpty(&BStack_c8,&LStack_e0);
        LogicalType::~LogicalType(&LStack_e0);
        Value::Value(&VStack_120,val);
        NumericStats::SetMin(&BStack_c8,&VStack_120);
        Value::~Value(&VStack_120);
        Value::Value(&VStack_120,val_00);
        NumericStats::SetMax(&BStack_c8,&VStack_120);
        Value::~Value(&VStack_120);
        pvVar4 = vector<duckdb::BaseStatistics,_true>::get<true>
                           ((vector<duckdb::BaseStatistics,_true> *)result_data,0);
        BaseStatistics::CopyValidity(&BStack_c8,pvVar4);
        BaseStatistics::ToUnique((BaseStatistics *)ldata);
        BaseStatistics::~BaseStatistics(&BStack_c8);
        return;
      }
    }
    (((BaseStatistics *)ldata)->type).id_ = INVALID;
    (((BaseStatistics *)ldata)->type).physical_type_ = ~INVALID;
    *(undefined6 *)&(((BaseStatistics *)ldata)->type).field_0x2 = 0;
    return;
  }
  if (adds_nulls) {
    TemplatedValidityMask<unsigned_long>::Copy
              (&result_mask->super_TemplatedValidityMask<unsigned_long>,
               &mask->super_TemplatedValidityMask<unsigned_long>,count);
  }
  else {
    TemplatedValidityMask<unsigned_long>::Initialize
              (&result_mask->super_TemplatedValidityMask<unsigned_long>,
               &mask->super_TemplatedValidityMask<unsigned_long>);
  }
  pVVar5 = (ValidityMask *)(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar6 = 0;
  result_data = (long *)(BaseStatistics *)0x0;
  do {
    if (uVar6 == count + 0x3f >> 6) {
      return;
    }
    if (pVVar5 == (ValidityMask *)0x0) {
      ldata = (interval_t *)((long)&((BaseStatistics *)result_data)->stats_union + 0x18);
      if (count <= ldata) {
        ldata = (interval_t *)count;
      }
LAB_00cb2ee6:
      pBVar3 = (BaseStatistics *)result_data;
      if (result_data < ldata) goto LAB_00cb2f16;
    }
    else {
      result_mask = (ValidityMask *)
                    (&(pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_mask)[uVar6];
      ldata = (interval_t *)&(((BaseStatistics *)result_data)->stats_union).numeric_data.max;
      if (count <= ldata) {
        ldata = (interval_t *)count;
      }
      if (result_mask == (ValidityMask *)0xffffffffffffffff) goto LAB_00cb2ee6;
      pBVar3 = (BaseStatistics *)ldata;
      if (result_mask != (ValidityMask *)0x0) {
        dataptr = ldata;
        if (ldata < result_data) {
          dataptr = result_data;
        }
        for (uVar7 = 0; pBVar3 = (BaseStatistics *)dataptr,
            (BaseStatistics *)
            ((long)&(((_Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                       *)&(((BaseStatistics *)result_data)->type).id_)->_M_impl).
                    super__Vector_impl_data._M_start + uVar7) < ldata; uVar7 = uVar7 + 1) {
          if (((ulong)result_mask >> (uVar7 & 0x3f) & 1) != 0) goto LAB_00cb2f16;
        }
      }
    }
    uVar6 = uVar6 + 1;
    result_data = (long *)pBVar3;
  } while( true );
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}